

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,VariableDeclarationNode *node)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  PrintVisitor *this_00;
  string *psVar3;
  element_type *peVar4;
  VariableDeclarationNode *in_RSI;
  long in_RDI;
  PrintVisitor visitor;
  key_type *in_stack_fffffffffffffed8;
  unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffee0;
  uint indentation;
  ostream *in_stack_fffffffffffffee8;
  PrintVisitor *in_stack_fffffffffffffef0;
  PrintVisitor *in_stack_ffffffffffffff08;
  string local_98 [32];
  undefined1 local_78 [24];
  string local_60 [48];
  string local_30 [32];
  VariableDeclarationNode *local_10;
  
  poVar1 = *(ostream **)(in_RDI + 8);
  local_10 = in_RSI;
  indent_abi_cxx11_(in_stack_ffffffffffffff08);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,"VariableDeclarationNode (");
  VariableDeclarationNode::getType(local_10);
  pmVar2 = std::
           unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  indentation = (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  poVar1 = std::operator<<(poVar1,(string *)pmVar2);
  std::operator<<(poVar1,"):\n");
  std::__cxx11::string::~string(local_30);
  poVar1 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_ffffffffffffff08);
  poVar1 = std::operator<<(poVar1,local_60);
  this_00 = (PrintVisitor *)std::operator<<(poVar1,"Name: ");
  psVar3 = VariableDeclarationNode::getName_abi_cxx11_(local_10);
  poVar1 = std::operator<<((ostream *)this_00,(string *)psVar3);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_60);
  PrintVisitor(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,indentation);
  poVar1 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(this_00);
  poVar1 = std::operator<<(poVar1,local_98);
  std::operator<<(poVar1,"Value:\n");
  std::__cxx11::string::~string(local_98);
  VariableDeclarationNode::getValue(local_10);
  peVar4 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x167392);
  (*(peVar4->super_Node)._vptr_Node[2])(peVar4,local_78);
  ~PrintVisitor((PrintVisitor *)0x1673b5);
  return;
}

Assistant:

void PrintVisitor::visit(const VariableDeclarationNode& node)
{
  stream_ << indent() << "VariableDeclarationNode (" 
    << TypeNameStrings.at(node.getType()) << "):\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Value:\n";
  node.getValue()->accept(visitor);
}